

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIP.c
# Opt level: O0

int GeoIP_id_by_ipnum_v6(GeoIP *gi,geoipv6_t ipnum)

{
  uint uVar1;
  int ret;
  GeoIP *gi_local;
  geoipv6_t ipnum_local;
  
  if (((gi->databaseType == '\f') || (gi->databaseType == '\b')) || (gi->databaseType == '\n')) {
    uVar1 = _GeoIP_seek_record_v6(gi,ipnum);
    ipnum_local.__in6_u.__u6_addr32[2] = uVar1 - 0xffff00;
  }
  else {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[(int)gi->databaseType],
           GeoIPDBDescription[0xc]);
    ipnum_local.__in6_u.__u6_addr32[2] = 0;
  }
  return ipnum_local.__in6_u.__u6_addr32[2];
}

Assistant:

int GeoIP_id_by_ipnum_v6 (GeoIP* gi, geoipv6_t ipnum) {
       int ret;
/*     if (ipnum == 0) {
               return 0;
       }
*/     
       if (gi->databaseType != GEOIP_COUNTRY_EDITION_V6 && 
                       gi->databaseType != GEOIP_PROXY_EDITION &&
                       gi->databaseType != GEOIP_NETSPEED_EDITION) {
               printf("Invalid database type %s, expected %s\n",
                                        GeoIPDBDescription[(int)gi->databaseType],
                                        GeoIPDBDescription[GEOIP_COUNTRY_EDITION_V6]);
               return 0;
       }
       ret = _GeoIP_seek_record_v6(gi, ipnum) - COUNTRY_BEGIN;
       return ret;
}